

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.cc
# Opt level: O3

void __thiscall gmath::OrthoCamera::OrthoCamera(OrthoCamera *this,Properties *prop)

{
  double dVar1;
  bool bVar2;
  int iVar3;
  Vector3d T;
  string origin;
  SVector<double,_3> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  Camera::Camera(&this->super_Camera,prop,-1);
  (this->super_Camera)._vptr_Camera = (_func_int **)&PTR__Camera_001778f0;
  gutil::Properties::getValue<double>(prop,"resolution",&this->res,(char *)0x0);
  gutil::Properties::getValue<double>(prop,"depth.resolution",&this->dres,"1");
  bVar2 = gutil::Properties::contains(prop,"origin.T");
  if (bVar2) {
    local_58.v[0] = 0.0;
    local_58.v[1] = 0.0;
    local_58.v[2] = 0.0;
    gutil::Properties::getValue<gmath::SVector<double,3>>(prop,"origin.T",&local_58,(char *)0x0);
    local_40._M_string_length = 0;
    local_40.field_2._M_local_buf[0] = '\0';
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    gutil::Properties::getValue<std::__cxx11::string>(prop,"origin",&local_40,"corner");
    iVar3 = std::__cxx11::string::compare((char *)&local_40);
    if (iVar3 == 0) {
      dVar1 = this->res * 0.5;
      local_58.v[0] = local_58.v[0] - dVar1;
      local_58.v[1] = dVar1 + local_58.v[1];
    }
    (this->super_Camera).T.v[2] = local_58.v[2];
    (this->super_Camera).T.v[0] = local_58.v[0];
    (this->super_Camera).T.v[1] = local_58.v[1];
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
  }
  return;
}

Assistant:

OrthoCamera::OrthoCamera(const gutil::Properties &prop)
  : Camera(prop, -1)
{
  prop.getValue("resolution", res);
  prop.getValue("depth.resolution", dres, "1");

  if (prop.contains("origin.T"))
  {
    Vector3d T;
    prop.getValue("origin.T", T);

    std::string origin;
    prop.getValue("origin", origin, "corner");

    if (origin == "center")
    {
      T[0]-=res/2;
      T[1]+=res/2;
    }

    setT(T);
  }
}